

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_>::relocate
          (QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *this,qsizetype offset,
          _Rb_tree_const_iterator<Node<Include>_> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *in_RDI;
  _Rb_tree_const_iterator<Node<Include>_> **unaff_retaddr;
  _Rb_tree_const_iterator<Node<Include>_> *res;
  _Rb_tree_const_iterator<Node<Include>_> *first;
  QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>_>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<std::_Rb_tree_const_iterator<Node<Include>>,long_long>
            (first,(longlong)in_RDI,(_Rb_tree_const_iterator<Node<Include>_> *)0x13f0a7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::_Rb_tree_const_iterator<Node<Include>>>,std::_Rb_tree_const_iterator<Node<Include>>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }